

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::SumSquares1DTest_ExtremeValues_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<libaom_test::FuncParam<unsigned_long(*)(short_const*,unsigned_int)>>::
  parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x38);
  anon_unknown.dwarf_1ccf507::SumSquares1DTest::SumSquares1DTest((SumSquares1DTest *)this_00);
  (((FunctionEquivalenceTest<unsigned_long_(*)(const_short_*,_unsigned_int)> *)&this_00->_vptr_Test)
  ->super_TestWithParam<libaom_test::FuncParam<unsigned_long_(*)(const_short_*,_unsigned_int)>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_00f644d0;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SumSquares1DTest_ExtremeValues_Test_00f64510;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }